

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alternative_function.hpp
# Opt level: O3

bool __thiscall
boost::spirit::karma::detail::
alternative_generate_function<boost::spirit::karma::detail::output_iterator<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,mpl_::int_<15>,boost::spirit::unused_type>,boost::spirit::unused_type_const,boost::spirit::unused_type,boost::spirit::unused_type,mpl_::bool_<false>>
::operator()(alternative_generate_function<boost::spirit::karma::detail::output_iterator<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,mpl_::int_<15>,boost::spirit::unused_type>,boost::spirit::unused_type_const,boost::spirit::unused_type,boost::spirit::unused_type,mpl_::bool_<false>>
             *this,sequence<boost::fusion::cons<boost::spirit::karma::lazy_generator<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::eps>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::greater_equal,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<unsigned_int>_>,_0L>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<int>,_0L>_>_>,_2L>_>_>,_2L>_>,_boost::spirit::unused_type>,_boost::fusion::cons<boost::spirit::karma::action<boost::spirit::karma::eps_generator,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<unsigned_char>_>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<int>,_0L>_>_>,_2L>_>_>,_boost::fusion::nil_>_>_>
                   *component)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  undefined8 uVar4;
  output_iterator<std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_mpl_::int_<15>,_boost::spirit::unused_type>
  *in_R8;
  enable_buffering<boost::spirit::karma::detail::output_iterator<std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
  buffering;
  enable_buffering<boost::spirit::karma::detail::output_iterator<std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
  local_c8;
  buffer_sink *local_88;
  counting_sink<boost::spirit::karma::detail::output_iterator<std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
  *pcStack_80;
  size_t local_78;
  size_t sStack_70;
  size_t local_68;
  undefined1 local_60;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *local_58;
  output_iterator<std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_mpl_::int_<15>,_boost::spirit::unused_type>
  local_50;
  
  enable_buffering<boost::spirit::karma::detail::output_iterator<std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
  ::enable_buffering(&local_c8,
                     *(output_iterator<std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_mpl_::int_<15>,_boost::spirit::unused_type>
                       **)this,0xffffffffffffffff);
  lVar3 = *(long *)this;
  uVar4 = *(undefined8 *)(lVar3 + 8);
  *(undefined8 *)(lVar3 + 8) = 0;
  uVar1 = *(component->super_base_sequence<_7f808f9f_>).elements.car.func.proto_expr_.child1.
           proto_expr_.child0.proto_expr_.child0.t_;
  uVar2 = (((proto_child1 *)
           ((long)&(component->super_base_sequence<_7f808f9f_>).elements.car.func.proto_expr_.child1
                   .proto_expr_ + 8))->proto_expr_).child0;
  if (uVar1 < uVar2) {
    *(undefined8 *)(lVar3 + 8) = uVar4;
  }
  else {
    *(component->super_base_sequence<_7f808f9f_>).elements.cdr.car.f.proto_expr_.child0.child0.t_ =
         (uchar)(component->super_base_sequence<_7f808f9f_>).elements.cdr.car.f.proto_expr_.child1.
                proto_expr_.child0;
    *(undefined8 *)(lVar3 + 8) = uVar4;
    enable_buffering<boost::spirit::karma::detail::output_iterator<std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
    ::disable(&local_c8);
    local_88 = ((local_c8.sink)->super_type).super_buffering_policy.buffer;
    pcStack_80 = ((local_c8.sink)->super_type).
                 super_counting_policy<boost::spirit::karma::detail::output_iterator<std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
                 .count;
    local_68 = ((local_c8.sink)->super_type).super_position_policy.track_position_data.column;
    local_78 = ((local_c8.sink)->super_type).super_position_policy.track_position_data.count;
    sStack_70 = ((local_c8.sink)->super_type).super_position_policy.track_position_data.line;
    local_60 = ((local_c8.sink)->super_type).do_output;
    local_58 = (local_c8.sink)->sink;
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<wchar_t_const*,boost::spirit::karma::detail::output_iterator<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,mpl_::int_<15>,boost::spirit::unused_type>>
              (&local_50,
               (__copy_move<false,false,std::random_access_iterator_tag> *)
               local_c8.buffer_data.buffer._M_dataplus._M_p,
               (wchar_t *)
               (local_c8.buffer_data.buffer._M_dataplus._M_p +
               local_c8.buffer_data.buffer._M_string_length),(wchar_t *)&local_88,in_R8);
  }
  enable_buffering<boost::spirit::karma::detail::output_iterator<std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_mpl_::int_<15>,_boost::spirit::unused_type>_>
  ::~enable_buffering(&local_c8);
  return uVar2 <= uVar1;
}

Assistant:

bool operator()(Component const& component)
        {
            typedef
                typename traits::attribute_of<Component, Context>::type
            expected_type;
            typedef
                alternative_generate<Component, Attribute, expected_type>
            generate;

            // wrap the given output iterator avoid output as long as one
            // component fails
            detail::enable_buffering<OutputIterator> buffering(sink);
            bool r = false;
            bool failed = false;    // will be ignored
            {
                detail::disable_counting<OutputIterator> nocounting(sink);
                r = generate::call(component, sink, ctx, delim, attr, failed);
            }
            if (r) 
                buffering.buffer_copy();
            return r;
        }